

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.cpp
# Opt level: O3

void __thiscall blc::math::Float::Float(Float *this,double i,int E)

{
  double dVar1;
  
  (this->super_serializable)._vptr_serializable = (_func_int **)&PTR_serialize_abi_cxx11__0011aa70;
  this->_nb = i;
  this->_E = E;
  if ((i != 0.0) || (NAN(i))) {
    dVar1 = ABS(i);
    if (dVar1 <= 1.0) {
      if (dVar1 < 1.0) {
        do {
          E = E + -1;
          i = i * 10.0;
        } while (ABS(i) < 1.0);
        goto LAB_0010ccb1;
      }
    }
    else if (10.0 <= dVar1) {
      do {
        E = E + 1;
        i = i / 10.0;
      } while (10.0 <= ABS(i));
LAB_0010ccb1:
      this->_E = E;
      this->_nb = i;
      return;
    }
  }
  return;
}

Assistant:

blc::math::Float::Float(double i, int E) : _nb(i), _E(E) {
	if (this->_nb == 0)
		return;
	if (this->_nb > 1 || this->_nb < -1) {
		for (; this->_nb >= 10 || this->_nb <= -10;) {
			this->_E++;
			this->_nb /= 10;
		}
	} else {
		for (; this->_nb < 1 && this->_nb > -1;) {
			this->_E--;
			this->_nb *= 10;
		}
	}
}